

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

size_t filter_letters(char *from,char *to)

{
  long local_28;
  size_t n;
  size_t o;
  char *to_local;
  char *from_local;
  
  n = 0;
  for (local_28 = 0; from[local_28] != '\0'; local_28 = local_28 + 1) {
    if ((('@' < from[local_28]) && (from[local_28] < '[')) ||
       (('`' < from[local_28] && (from[local_28] < '{')))) {
      to[n] = from[local_28];
      n = n + 1;
    }
  }
  to[n] = '\0';
  return n;
}

Assistant:

size_t filter_letters(const char* from, char* to) {
  size_t o = 0;
  for (size_t n = 0; from[n]; n++) {
    if ((from[n] >= 'A' && from[n] <= 'Z') || (from[n] >= 'a' && from[n] <= 'z')) {
      to[o++] = from[n];
    }
  }
  to[o] = 0;
  return o;
}